

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O1

bool __thiscall
optimization::livevar_analyse::Livevar_Analyse::bfs_build(Livevar_Analyse *this,BasicBlk *start)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  BasicBlk *pBVar4;
  undefined8 *******pppppppuVar5;
  undefined8 *******pppppppuVar6;
  bool bVar7;
  _List_node_base *p_Var8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  ulong uVar13;
  value_type id;
  list<int,_std::allocator<int>_> queue;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int local_80;
  uint local_7c;
  undefined8 *******local_78;
  undefined8 *******local_70;
  long local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_68 = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &local_78;
  local_70 = &local_78;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var8 = (_List_node_base *)operator_new(0x18);
  *(LabelId *)&p_Var8[1]._M_next = start->id;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  local_68 = local_68 + 1;
  uVar13 = 0;
  while ((undefined8 ********)local_78 != &local_78) {
    local_80 = *(int *)(local_78 + 2);
    p_Var11 = &p_Var1->_M_header;
    for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < local_80]) {
      if (local_80 <= (int)*(size_t *)(p_Var3 + 1)) {
        p_Var11 = p_Var3;
      }
    }
    p_Var12 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var12 = (_Rb_tree_header *)p_Var11,
       local_80 < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
      p_Var12 = p_Var1;
    }
    if (p_Var12 == p_Var1) {
      pmVar9 = std::
               map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
               ::at(&this->livevars,&local_80);
      bVar7 = Block_Live_Var::build
                        ((pmVar9->
                         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_80);
      pmVar9 = std::
               map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
               ::at(&this->livevars,&local_80);
      local_7c = (uint)CONCAT71((int7)(uVar13 >> 8),(byte)uVar13 | bVar7);
      pBVar4 = ((pmVar9->
                super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->block;
      for (p_Var10 = *(_Base_ptr *)
                      ((long)&(pBVar4->preceding)._M_t._M_impl.super__Rb_tree_header._M_header +
                      0x10);
          (_Rb_tree_header *)p_Var10 != &(pBVar4->preceding)._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        _Var2 = p_Var10[1]._M_color;
        p_Var8 = (_List_node_base *)operator_new(0x18);
        *(_Rb_tree_color *)&p_Var8[1]._M_next = _Var2;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        local_68 = local_68 + 1;
      }
      uVar13 = (ulong)local_7c;
    }
    pppppppuVar6 = local_78;
    local_68 = local_68 + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pppppppuVar6,0x18);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  pppppppuVar6 = local_78;
  while ((undefined8 ********)pppppppuVar6 != &local_78) {
    pppppppuVar5 = (undefined8 *******)*pppppppuVar6;
    operator_delete(pppppppuVar6,0x18);
    pppppppuVar6 = pppppppuVar5;
  }
  return (bool)((byte)uVar13 & 1);
}

Assistant:

bool bfs_build(mir::inst::BasicBlk& start) {
    std::list<mir::types::LabelId> queue;
    std::set<mir::types::LabelId> visited;
    queue.push_back(start.id);
    bool modify = false;
    while (!queue.empty()) {
      auto id = queue.front();
      if (!visited.count(id)) {
        modify |= livevars.at(id)->build();
        visited.insert(id);
        for (auto pre : livevars.at(id)->block.preceding) {
          queue.push_back(pre);
        }
      }
      queue.pop_front();
    }

    return modify;
  }